

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O1

void P_LoadVertexes(MapData *map)

{
  FileReader *pFVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  undefined8 in_RAX;
  long lVar4;
  vertex_t *pvVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  SWORD y;
  SWORD x;
  undefined8 uStack_38;
  
  pFVar1 = map->MapLumps[4].Reader;
  if (pFVar1 == (FileReader *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (uint)pFVar1->Length;
  }
  numvertexes = uVar3 >> 2;
  numvertexdatas = 0;
  uStack_38 = in_RAX;
  if (uVar3 < 4) {
    I_Error("Map has no vertices.\n");
  }
  uVar8 = (ulong)numvertexes;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar8;
  uVar6 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x38),8) == 0) {
    uVar6 = SUB168(auVar2 * ZEXT816(0x38),0);
  }
  vertexes = (vertex_t *)operator_new__(uVar6);
  if (uVar8 != 0) {
    pvVar5 = vertexes;
    do {
      (pvVar5->p).X = 0.0;
      (pvVar5->p).Y = 0.0;
      pvVar5->viewangle = 0;
      pvVar5->angletime = 0;
      pvVar5->dirty = true;
      pvVar5->numheights = 0;
      pvVar5->numsectors = 0;
      pvVar5->sectors = (sector_t **)0x0;
      pvVar5->heightlist = (float *)0x0;
      pvVar5 = pvVar5 + 1;
    } while (pvVar5 != vertexes + uVar8);
  }
  vertexdatas = (vertexdata_t *)0x0;
  pFVar1 = map->MapLumps[4].Reader;
  map->file = pFVar1;
  (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar1,0,0);
  if (0 < numvertexes) {
    lVar7 = 8;
    lVar4 = 0;
    do {
      pFVar1 = map->file;
      (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar1,(long)&uStack_38 + 6,2);
      (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar1,(long)&uStack_38 + 4,2);
      pvVar5 = vertexes;
      *(double *)((long)vertexes + lVar7 + -8) = (double)(int)uStack_38._6_2_;
      *(double *)((long)&(pvVar5->p).X + lVar7) = (double)(int)uStack_38._4_2_;
      lVar4 = lVar4 + 1;
      lVar7 = lVar7 + 0x38;
    } while (lVar4 < numvertexes);
  }
  return;
}

Assistant:

void P_LoadVertexes (MapData * map)
{
	int i;

	// Determine number of vertices:
	//	total lump length / vertex record length.
	numvertexes = map->Size(ML_VERTEXES) / sizeof(mapvertex_t);
	numvertexdatas = 0;

	if (numvertexes == 0)
	{
		I_Error ("Map has no vertices.\n");
	}

	// Allocate memory for buffer.
	vertexes = new vertex_t[numvertexes];		
	vertexdatas = NULL;

	map->Seek(ML_VERTEXES);
		
	// Copy and convert vertex coordinates, internal representation as fixed.
	for (i = 0; i < numvertexes; i++)
	{
		SWORD x, y;

		(*map->file) >> x >> y;
		vertexes[i].set(double(x), double(y));
	}
}